

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int tconcat(lua_State *L)

{
  int iVar1;
  int idx;
  luaL_Buffer *b_00;
  lua_Integer lVar2;
  size_t sVar3;
  lua_State *in_RDI;
  char *sep;
  int last;
  int i;
  size_t lsep;
  luaL_Buffer b;
  int in_stack_ffffffffffffdfb8;
  int in_stack_ffffffffffffdfbc;
  undefined4 in_stack_ffffffffffffdfc0;
  undefined4 in_stack_ffffffffffffdfc4;
  char *in_stack_ffffffffffffdfc8;
  undefined4 in_stack_ffffffffffffdfd0;
  int iVar4;
  int in_stack_ffffffffffffdfd4;
  lua_State *in_stack_ffffffffffffdfd8;
  luaL_Buffer local_2020;
  lua_State *local_8;
  
  local_8 = in_RDI;
  b_00 = (luaL_Buffer *)
         luaL_optlstring(in_stack_ffffffffffffdfd8,in_stack_ffffffffffffdfd4,
                         in_stack_ffffffffffffdfc8,
                         (size_t *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0));
  luaL_checktype((lua_State *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                 in_stack_ffffffffffffdfbc,in_stack_ffffffffffffdfb8);
  lVar2 = luaL_optinteger((lua_State *)CONCAT44(in_stack_ffffffffffffdfd4,in_stack_ffffffffffffdfd0)
                          ,(int)((ulong)b_00 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0));
  idx = (int)lVar2;
  iVar1 = lua_type((lua_State *)CONCAT44(idx,in_stack_ffffffffffffdfd0),(int)((ulong)b_00 >> 0x20));
  if (iVar1 < 1) {
    sVar3 = lua_objlen(in_stack_ffffffffffffdfd8,idx);
    iVar1 = (int)sVar3;
  }
  else {
    lVar2 = luaL_checkinteger((lua_State *)
                              CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                              in_stack_ffffffffffffdfbc);
    iVar1 = (int)lVar2;
  }
  iVar4 = iVar1;
  luaL_buffinit(local_8,&local_2020);
  for (; idx < iVar4; idx = idx + 1) {
    addfield((lua_State *)CONCAT44(idx,iVar4),b_00,iVar1);
    luaL_addlstring((luaL_Buffer *)CONCAT44(idx,iVar4),(char *)b_00,
                    CONCAT44(iVar1,in_stack_ffffffffffffdfc0));
  }
  if (idx == iVar4) {
    addfield((lua_State *)CONCAT44(idx,iVar4),b_00,iVar1);
  }
  luaL_pushresult((luaL_Buffer *)0x11b31e);
  return 1;
}

Assistant:

static int tconcat(lua_State*L){
luaL_Buffer b;
size_t lsep;
int i,last;
const char*sep=luaL_optlstring(L,2,"",&lsep);
luaL_checktype(L,1,5);
i=luaL_optint(L,3,1);
last=luaL_opt(L,luaL_checkint,4,luaL_getn(L,1));
luaL_buffinit(L,&b);
for(;i<last;i++){
addfield(L,&b,i);
luaL_addlstring(&b,sep,lsep);
}
if(i==last)
addfield(L,&b,i);
luaL_pushresult(&b);
return 1;
}